

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O1

void __thiscall streams_tests::streams_vector_reader::test_method(streams_vector_reader *this)

{
  size_t sVar1;
  undefined1 **ppuVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  check_type cVar5;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined4 local_39c;
  size_t **local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  SpanReader new_reader;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  int d;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  uint c;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  int8_t b;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  uchar a;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  uint32_t obj_5;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  SpanReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  uint32_t obj_3;
  undefined8 ***local_b0;
  assertion_result local_a8;
  size_t ****local_90;
  size_t ***local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  uint8_t obj;
  undefined2 uStack_52;
  bool local_50;
  undefined1 *local_48;
  lazy_ostream *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _obj = (undefined **)CONCAT26(uStack_52,0x6050403ff01);
  __l._M_len = 6;
  __l._M_array = &obj;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&vch,__l,(allocator_type *)&local_a8);
  reader.m_data.m_size =
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x87;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  new_reader.m_data.m_data = (uchar *)&local_b0;
  local_b0 = (undefined8 ***)reader.m_data.m_size;
  local_88 = &local_398;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reader.m_data.m_size == 6);
  local_398._0_4_ = 6;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_40 = (lazy_ostream *)&new_reader;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3cf0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf6b500,(size_t)&local_80,0x87,&obj,"6U",
             (allocator_type *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64deda;
  file_00.m_end = (iterator)0x88;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _obj_5 = (undefined **)0xf6b4d8;
  local_118 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_148 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  sVar1 = 0x88;
  local_40 = (lazy_ostream *)&obj_5;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,0,WARN,_cVar5,(size_t)&local_150,0x88);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  SpanReader::read(&reader,(int)&obj,(void *)0x1,sVar1);
  a = obj;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8d;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b0 = (undefined8 ***)CONCAT44(local_b0._4_4_,1);
  new_reader.m_data.m_data = &a;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(a == '\x01');
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d4aa0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = (size_t ***)&local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xec3ed7,(size_t)&local_80,0x8d,&obj,"1",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8e;
  file_02.m_begin = (iterator)&local_188;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_198,
             msg_02);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b0 = (undefined8 ***)reader.m_data.m_size;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reader.m_data.m_size == 5);
  local_398._0_4_ = 5;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  new_reader.m_data.m_data = (uchar *)&local_b0;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3cf0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = &local_398;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf6b500,(size_t)&local_80,0x8e,&obj,"5U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64e281;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _obj_5 = (undefined **)0xf6b4d8;
  local_118 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1c0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  sVar1 = 0x8f;
  local_40 = (lazy_ostream *)&obj_5;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,0,WARN,_cVar5,(size_t)&local_1c8,0x8f);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  SpanReader::read(&reader,(int)&obj,(void *)0x1,sVar1);
  b = obj;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x94;
  file_04.m_begin = (iterator)&local_1e0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f0,
             msg_04);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b0 = (undefined8 ***)CONCAT44(local_b0._4_4_,0xffffffff);
  new_reader.m_data.m_data = (uchar *)&b;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(b == -1);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d88d8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = (size_t ***)&local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xe81e5f,(size_t)&local_80,0x94,&obj,"-1",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x95;
  file_05.m_begin = (iterator)&local_200;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_210,
             msg_05);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b0 = (undefined8 ***)reader.m_data.m_size;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reader.m_data.m_size == 4);
  local_398._0_4_ = 4;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  new_reader.m_data.m_data = (uchar *)&local_b0;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3cf0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = &local_398;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf6b500,(size_t)&local_80,0x95,&obj,"4U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64e617;
  file_06.m_end = (iterator)0x96;
  file_06.m_begin = (iterator)&local_220;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_230,
             msg_06);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _obj_5 = (undefined **)0xf6b4d8;
  local_118 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_238 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  sVar1 = 0x96;
  local_40 = (lazy_ostream *)&obj_5;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,0,WARN,_cVar5,(size_t)&local_240,0x96);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  SpanReader::read(&reader,(int)&obj,(void *)0x4,sVar1);
  c = _obj;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x9b;
  file_07.m_begin = (iterator)&local_258;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_268,
             msg_07);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  new_reader.m_data.m_data = (uchar *)&c;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(c == 0x6050403);
  local_b0 = (undefined8 ***)CONCAT44(local_b0._4_4_,0x6050403);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3d30;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = (size_t ***)&local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf9edd2,(size_t)&local_80,0x9b,&obj,
             "100992003U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x9c;
  file_08.m_begin = (iterator)&local_278;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_288,
             msg_08);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b0 = (undefined8 ***)reader.m_data.m_size;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reader.m_data.m_size == 0);
  local_398._0_4_ = 0;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  new_reader.m_data.m_data = (uchar *)&local_b0;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3cf0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&new_reader;
  local_88 = &local_398;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf6b500,(size_t)&local_80,0x9c,&obj,"0U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64e9a6;
  file_09.m_end = (iterator)0x9d;
  file_09.m_begin = (iterator)&local_298;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2a8,
             msg_09);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _obj_5 = (undefined **)0xf6b4d9;
  local_118 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_40 = (lazy_ostream *)&obj_5;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,0,WARN,_cVar5,(size_t)&local_2b8,0x9d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2c8 = "";
  ppuVar2 = &local_2e0;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa1;
  file_10.m_begin = (iterator)&local_2d0;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar2,msg_10);
  SpanReader::read(&reader,(int)&obj_3,(void *)0x4,(size_t)ppuVar2);
  d = obj_3;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64eac5;
  file_11.m_end = (iterator)0xa1;
  file_11.m_begin = (iterator)&local_2f0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_300,
             msg_11);
  local_a8._0_8_ = (ulong)(uint7)local_a8._1_7_ << 8;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3ef0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)0xe80289;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_308 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,1,WARN,_cVar5,(size_t)&local_310,0xa1);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  new_reader.m_data.m_size =
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  new_reader.m_data.m_data =
       vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  SpanReader::read(&new_reader,(int)&obj,(void *)0x4,new_reader.m_data.m_size);
  d = _obj;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xa6;
  file_12.m_begin = (iterator)&local_360;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_370,
             msg_12);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_88 = (size_t ***)&d;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(d == 0x403ff01);
  local_398 = (size_t **)CONCAT44(local_398._4_4_,0x403ff01);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3e70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&local_88;
  local_b0 = &local_398;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xed8ba2,(size_t)&local_80,0xa6,&obj,
             "67370753",&local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xa7;
  file_13.m_begin = (iterator)&local_380;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_390,
             msg_13);
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  _obj_5 = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_398 = (size_t **)new_reader.m_data.m_size;
  local_b0 = (undefined8 ***)&local_39c;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(new_reader.m_data.m_size == 2);
  local_39c = 2;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_88 = &local_398;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3cf0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&obj_5,1,2,REQUIRE,0xf6b4fc,(size_t)&local_80,0xa7,&obj,"2U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64ee69;
  file_14.m_end = (iterator)0xa8;
  file_14.m_begin = (iterator)&local_3b0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c0,
             msg_14);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _obj_5 = (undefined **)0xf6b50e;
  local_118 = "";
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_40 = (lazy_ostream *)&obj_5;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(new_reader.m_data.m_size != 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,0,WARN,_cVar5,(size_t)&local_3d0,0xa8);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3d8 = "";
  ppuVar2 = &local_3f0;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xac;
  file_15.m_begin = (iterator)&local_3e0;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)ppuVar2,msg_15);
  SpanReader::read(&new_reader,(int)&obj_5,(void *)0x4,(size_t)ppuVar2);
  d = obj_5;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x64ef7c;
  file_16.m_end = (iterator)0xac;
  file_16.m_begin = (iterator)&local_400;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_410,
             msg_16);
  local_a8._0_8_ = (ulong)(uint7)local_a8._1_7_ << 8;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_50 = false;
  _obj = &PTR__lazy_ostream_013d3ef0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)0xe80289;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_418 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,1,WARN,_cVar5,(size_t)&local_420,0xac);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_reader)
{
    std::vector<unsigned char> vch = {1, 255, 3, 4, 5, 6};

    SpanReader reader{vch};
    BOOST_CHECK_EQUAL(reader.size(), 6U);
    BOOST_CHECK(!reader.empty());

    // Read a single byte as an unsigned char.
    unsigned char a;
    reader >> a;
    BOOST_CHECK_EQUAL(a, 1);
    BOOST_CHECK_EQUAL(reader.size(), 5U);
    BOOST_CHECK(!reader.empty());

    // Read a single byte as a int8_t.
    int8_t b;
    reader >> b;
    BOOST_CHECK_EQUAL(b, -1);
    BOOST_CHECK_EQUAL(reader.size(), 4U);
    BOOST_CHECK(!reader.empty());

    // Read a 4 bytes as an unsigned int.
    unsigned int c;
    reader >> c;
    BOOST_CHECK_EQUAL(c, 100992003U); // 3,4,5,6 in little-endian base-256
    BOOST_CHECK_EQUAL(reader.size(), 0U);
    BOOST_CHECK(reader.empty());

    // Reading after end of byte vector throws an error.
    signed int d;
    BOOST_CHECK_THROW(reader >> d, std::ios_base::failure);

    // Read a 4 bytes as a signed int from the beginning of the buffer.
    SpanReader new_reader{vch};
    new_reader >> d;
    BOOST_CHECK_EQUAL(d, 67370753); // 1,255,3,4 in little-endian base-256
    BOOST_CHECK_EQUAL(new_reader.size(), 2U);
    BOOST_CHECK(!new_reader.empty());

    // Reading after end of byte vector throws an error even if the reader is
    // not totally empty.
    BOOST_CHECK_THROW(new_reader >> d, std::ios_base::failure);
}